

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cc
# Opt level: O0

bool __thiscall tchecker::zg::zone_t::operator<=(zone_t *this,zone_t *zone)

{
  bool bVar1;
  db_t *dbm1;
  db_t *dbm2;
  zone_t *zone_local;
  zone_t *this_local;
  
  if (this->_dim == zone->_dim) {
    bVar1 = is_empty(this);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = is_empty(zone);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        dbm1 = dbm_ptr(this);
        dbm2 = dbm_ptr(zone);
        this_local._7_1_ = tchecker::dbm::is_le(dbm1,dbm2,this->_dim);
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool zone_t::operator<=(tchecker::zg::zone_t const & zone) const
{
  if (_dim != zone._dim)
    return false;
  if (this->is_empty())
    return true;
  if (zone.is_empty())
    return false;
  return tchecker::dbm::is_le(dbm_ptr(), zone.dbm_ptr(), _dim);
}